

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_buffer_manager.cpp
# Opt level: O3

void __thiscall
duckdb::StandardBufferManager::SetTemporaryDirectory(StandardBufferManager *this,string *new_dir)

{
  mutex *__mutex;
  NotImplementedException *this_00;
  int iVar1;
  string local_48;
  
  __mutex = &(this->temporary_directory).lock;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar1 != 0) {
    ::std::__throw_system_error(iVar1);
  }
  if ((this->temporary_directory).handle.
      super_unique_ptr<duckdb::TemporaryDirectoryHandle,_std::default_delete<duckdb::TemporaryDirectoryHandle>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::TemporaryDirectoryHandle,_std::default_delete<duckdb::TemporaryDirectoryHandle>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::TemporaryDirectoryHandle_*,_std::default_delete<duckdb::TemporaryDirectoryHandle>_>
      .super__Head_base<0UL,_duckdb::TemporaryDirectoryHandle_*,_false>._M_head_impl ==
      (TemporaryDirectoryHandle *)0x0) {
    ::std::__cxx11::string::_M_assign((string *)&this->temporary_directory);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return;
  }
  this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,
             "Cannot switch temporary directory after the current one has been used","");
  NotImplementedException::NotImplementedException(this_00,&local_48);
  __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void StandardBufferManager::SetTemporaryDirectory(const string &new_dir) {
	lock_guard<mutex> guard(temporary_directory.lock);
	if (temporary_directory.handle) {
		throw NotImplementedException("Cannot switch temporary directory after the current one has been used");
	}
	temporary_directory.path = new_dir;
}